

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateString(Tables *this,string *value)

{
  string *this_00;
  string *local_20;
  string *result;
  string *value_local;
  Tables *this_local;
  
  result = value;
  value_local = (string *)this;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,(string *)result);
  local_20 = this_00;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::push_back(&this->strings_,&local_20);
  return local_20;
}

Assistant:

string* DescriptorPool::Tables::AllocateString(const string& value) {
  string* result = new string(value);
  strings_.push_back(result);
  return result;
}